

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O1

void run_ops(uint64_t ops,rng_t *rng,uint64_t *lat,void *get_buffer)

{
  void *pvVar1;
  rng_t *state;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  int *piVar6;
  uint64_t *__dest;
  double *pdVar7;
  uint64_t *puVar8;
  ulong uVar9;
  ulong *puVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 uVar15;
  undefined1 auVar14 [16];
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [8];
  rng_t rng_1;
  uint64_t local_70;
  undefined1 *local_68;
  long local_60;
  void *local_58;
  rng_t *local_50;
  uint64_t local_48;
  ulong *local_40;
  uint64_t local_38;
  
  if (ops != 0) {
    local_38 = 0;
    pdVar7 = &local_a8;
    local_58 = get_buffer;
    local_50 = rng;
    local_48 = ops;
    do {
      state = local_50;
      local_40 = lat;
      *(undefined8 *)((long)pdVar7 + -8) = 0x104af1;
      uVar3 = rnd64_r(state);
      *(undefined8 *)((long)pdVar7 + -8) = 0x104aff;
      uVar3 = n_lowest_bits(uVar3,(int)key_diversity);
      puVar8 = (uint64_t *)((long)pdVar7 + -(key_size + 0x10 & 0xfffffffffffffff0));
      local_68 = (undefined1 *)pdVar7;
      puVar8[-1] = 0x104b29;
      randomize_r((rng_t *)local_98,uVar3);
      __dest = puVar8;
      for (uVar9 = key_size; 7 < uVar9; uVar9 = uVar9 - 8) {
        puVar8[-1] = 0x104b41;
        uVar4 = rnd64_r((rng_t *)local_98);
        *__dest = uVar4;
        __dest = __dest + 1;
      }
      if (uVar9 != 0) {
        puVar8[-1] = 0x104b5f;
        local_70 = rnd64_r((rng_t *)local_98);
        puVar8[-1] = 0x104b72;
        memcpy(__dest,&local_70,uVar9);
      }
      puVar10 = local_40;
      if (local_40 != (ulong *)0x0) {
        puVar8[-1] = 0x104b88;
        clock_gettime(1,(timespec *)local_98);
        local_60 = (long)local_98 * 1000000000 + rng_1[0];
      }
      pvVar1 = local_58;
      puVar8[-2] = 0;
      puVar8[-3] = 0x104bc8;
      lVar5 = vmemcache_get(cache,puVar8,key_size,pvVar1,get_size,0);
      uVar4 = min_size;
      uVar9 = 0;
      if (lVar5 < 0) {
        lVar5 = (max_size - min_size) + 1;
        auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar12._0_8_ = lVar5;
        auVar12._12_4_ = 0x45300000;
        local_a8 = (double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0;
        dStack_a0 = auVar12._8_8_ - 1.9342813113834067e+25;
        puVar8[-1] = 0x104c1a;
        uVar3 = hash64(uVar3 ^ vsize_seed);
        if (size_distrib == 2) {
          dVar11 = (double)(long)((1L << (byte)(uVar3 >> 0x3b)) - 1U & uVar3 | 1L << (uVar3 >> 0x3b)
                                 ) * 2.3283064365386963e-10;
        }
        else {
          uVar15 = (undefined4)(uVar3 >> 0x20);
          if (size_distrib == 1) {
            auVar13._8_4_ = uVar15;
            auVar13._0_8_ = uVar3;
            auVar13._12_4_ = 0x45300000;
            dVar11 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     5.421010862427522e-20;
            dVar11 = dVar11 * dVar11 * dVar11 * dVar11;
          }
          else {
            if (size_distrib != 0) goto LAB_00104dc0;
            auVar14._8_4_ = uVar15;
            auVar14._0_8_ = uVar3;
            auVar14._12_4_ = 0x45300000;
            dVar11 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     5.421010862427522e-20;
          }
        }
        dVar11 = (dStack_a0 + local_a8) * dVar11;
        uVar9 = (ulong)dVar11;
        uVar9 = uVar4 + ((long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9);
        if ((uVar9 < min_size) || (max_size < uVar9)) {
          puVar8[-1] = 0x104dbb;
          run_ops_cold_2();
LAB_00104dbb:
          puVar8[-1] = 0x104dc0;
          run_ops_cold_1();
LAB_00104dc0:
          puVar8[-1] = (uint64_t)get_stat;
          run_ops_cold_3();
          puVar8[-1] = (uint64_t)&stack0xfffffffffffffff8;
          puVar8[-2] = 0x104dde;
          iVar2 = vmemcache_get_stat();
          if (iVar2 == -1) {
            puVar8[-2] = (uint64_t)cmp_u64;
            get_stat_cold_1();
            puVar8[-2] = (uint64_t)(puVar8 + -1);
            return;
          }
          return;
        }
        puVar8[-1] = 0x104d39;
        iVar2 = vmemcache_put(cache,puVar8,key_size,lotta_zeroes,uVar9);
        puVar10 = local_40;
        uVar9 = 0x8000000000000000;
        if (iVar2 != 0) {
          puVar8[-1] = 0x104d50;
          piVar6 = __errno_location();
          if (*piVar6 != 0x11) goto LAB_00104dbb;
        }
      }
      if (puVar10 == (ulong *)0x0) {
        lat = (ulong *)0x0;
      }
      else {
        puVar8[-1] = 0x104d67;
        clock_gettime(1,(timespec *)local_98);
        *puVar10 = (rng_1[0] - local_60) + (long)local_98 * 1000000000 | uVar9;
        lat = puVar10 + 1;
      }
      local_38 = local_38 + 1;
      pdVar7 = (double *)local_68;
    } while (local_38 != local_48);
  }
  return;
}

Assistant:

static void
run_ops(uint64_t ops, rng_t *rng, uint64_t *lat, void *get_buffer)
{
	uint64_t opt, opt_tag;

	for (uint64_t count = 0; count < ops; count++) {
		uint64_t obj = n_lowest_bits(rnd64_r(rng), (int)key_diversity);

		char key[key_size + 1];
		fill_key(key, obj);

		if (lat)
			opt = getticks();

		if (vmemcache_get(cache, key, key_size, get_buffer, get_size, 0,
			NULL) < 0) {

			uint64_t size = min_size
				+ (uint64_t)((double)(max_size - min_size + 1)
				* rndlength(hash64(obj ^ vsize_seed)));
			UT_ASSERTin(size, min_size, max_size);

			if (vmemcache_put(cache, key, key_size, lotta_zeroes,
				size) && errno != EEXIST) {
				print_stats(cache);
				UT_FATAL("vmemcache_put failed: %s",
						vmemcache_errormsg());
			}

			opt_tag = PUT_TAG;
		} else {
			opt_tag = 0;
		}

		if (lat)
			*lat++ = (getticks() - opt) | opt_tag;
	}
}